

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSMisc.h
# Opt level: O2

double PID_control(double z_bar,double z_bar_prev,double z,double dz,double *piz,
                  double direction_coef,double dt,double Kp,double Kd,double Ki,double up_max,
                  double ud_max,double ui_max,double u_min,double u_max,double error_min,
                  double error_max,double dz_max)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  dVar6 = z_bar - z;
  if (dVar6 <= error_max) {
    if (error_min <= dVar6) {
      dVar7 = (double)(~-(ulong)(z_bar != z_bar_prev) & (ulong)*piz);
      dVar2 = dVar6 * Kp;
      if (ABS(dVar2) <= up_max) {
        if (0.0 <= direction_coef) {
          dVar2 = 1.0;
        }
        else if (direction_coef <= 0.0) {
          dVar2 = -1.0;
        }
        else {
          dVar2 = 0.0;
        }
        dVar2 = dVar2 * Kp * dVar6;
      }
      else {
        dVar3 = 1.0;
        dVar1 = 1.0;
        if (direction_coef < 0.0) {
          if (direction_coef <= 0.0) {
            dVar1 = -1.0;
          }
          else {
            dVar1 = 0.0;
          }
        }
        if ((dVar2 < 0.0) && (dVar3 = 0.0, dVar2 <= 0.0)) {
          dVar3 = -1.0;
        }
        dVar2 = dVar1 * dVar3 * up_max;
      }
      dVar3 = (-dz * Kd) / dz_max;
      if (ABS(dVar3) <= ud_max) {
        dVar3 = 0.0;
        if (0.0 <= direction_coef) {
          dVar3 = 1.0;
        }
        else if (direction_coef <= 0.0) {
          dVar3 = -1.0;
        }
        dVar3 = (dVar3 * Kd * -dz) / dz_max;
      }
      else {
        dVar4 = 1.0;
        dVar1 = 1.0;
        if (direction_coef < 0.0) {
          if (direction_coef <= 0.0) {
            dVar1 = -1.0;
          }
          else {
            dVar1 = 0.0;
          }
        }
        if ((dVar3 < 0.0) && (dVar4 = 0.0, dVar3 <= 0.0)) {
          dVar4 = -1.0;
        }
        dVar3 = dVar1 * dVar4 * ud_max;
      }
      dVar1 = dVar7 * Ki;
      if (ABS(dVar1) <= ui_max) {
        dVar1 = 0.0;
        if (0.0 <= direction_coef) {
          dVar1 = 1.0;
        }
        else if (direction_coef <= 0.0) {
          dVar1 = -1.0;
        }
        dVar1 = dVar1 * Ki * dVar7;
      }
      else {
        dVar5 = 1.0;
        dVar4 = 1.0;
        if (direction_coef < 0.0) {
          if (direction_coef <= 0.0) {
            dVar4 = -1.0;
          }
          else {
            dVar4 = 0.0;
          }
        }
        if ((dVar1 < 0.0) && (dVar5 = 0.0, dVar1 <= 0.0)) {
          dVar5 = -1.0;
        }
        dVar1 = dVar4 * dVar5 * ui_max;
      }
      dVar1 = dVar1 + dVar3 + dVar2 + 0.0;
      dVar7 = dVar6 * dt + dVar7;
    }
    else {
      dVar7 = 0.0;
      if (0.0 <= direction_coef) {
        dVar1 = 1.0;
      }
      else {
        dVar1 = 0.0;
        if (direction_coef <= 0.0) {
          dVar1 = -1.0;
        }
      }
      dVar1 = dVar1 * u_min;
    }
  }
  else {
    dVar7 = 0.0;
    if (0.0 <= direction_coef) {
      dVar1 = 1.0;
    }
    else {
      dVar1 = 0.0;
      if (direction_coef <= 0.0) {
        dVar1 = -1.0;
      }
    }
    dVar1 = dVar1 * u_max;
  }
  if (dVar1 <= u_max) {
    u_max = dVar1;
  }
  *piz = dVar7;
  return (double)(-(ulong)(dVar1 < u_min) & (ulong)u_min | ~-(ulong)(dVar1 < u_min) & (ulong)u_max);
}

Assistant:

inline double PID_control(double z_bar, double z_bar_prev, double z, double dz, double* piz, double direction_coef, double dt,
	double Kp, double Kd, double Ki, double up_max, double ud_max, double ui_max,
	double u_min, double u_max, double error_min, double error_max, double dz_max)
{
	double u = 0;
	double error = z_bar-z;
	double derivative = -dz;
	double integral = *piz;
	if (z_bar != z_bar_prev) integral = 0;
	if (error > error_max)
	{
		u = sign(direction_coef, 0)*u_max;
		integral = 0;
	}
	else if (error < error_min)
	{
		u = sign(direction_coef, 0)*u_min;
		integral = 0;
	}
	else
	{
		if (fabs(Kp*error) > up_max) u += sign(direction_coef, 0)*sign(Kp*error, 0)*up_max;
		else u += sign(direction_coef, 0)*Kp*error;
		if (fabs(Kd*derivative/dz_max) > ud_max) u += sign(direction_coef, 0)*sign(Kd*derivative/dz_max, 0)*ud_max;
		else u += sign(direction_coef, 0)*Kd*derivative/dz_max; // /dz_max to try to normalize...
		if (fabs(Ki*integral) > ui_max) u += sign(direction_coef, 0)*sign(Ki*integral, 0)*ui_max;
		else u += sign(direction_coef, 0)*Ki*integral;
		integral = integral+error*dt;
	}
	u = (u < u_min)? u_min: ((u > u_max)? u_max: u);
	*piz = integral;
	return u;
}